

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_35081::ArenaTest_FuzzFuseFreeAllocatorRace_Test::TestBody
          (ArenaTest_FuzzFuseFreeAllocatorRace_Test *this)

{
  upb_Arena *a;
  char *pcVar1;
  pointer ptVar2;
  pointer ptVar3;
  uint uVar4;
  upb_Arena *puVar5;
  allocator_type *paVar6;
  allocator_type *paVar7;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX_00;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX_01;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX_02;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX_03;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX_04;
  anon_class_24_3_d913d062_for__M_head_impl *__args;
  size_t i;
  long lVar8;
  ulong uVar9;
  allocator_type *paVar10;
  ulong uVar11;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  array<upb_Arena_*,_11UL> *paVar12;
  array<upb_Arena_*,_11UL> *paVar13;
  size_t j;
  long lVar14;
  HiRep HVar15;
  bool bVar16;
  byte bVar17;
  Time TVar18;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_> arenas;
  Notification done;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_upb_mem_arena_test_cc:512:40)>
  reset_max_block_size;
  array<upb_Arena_*,_11UL> arr;
  vector<std::thread,_std::allocator<std::thread>_> local_e8;
  size_type local_d0;
  upb_Arena local_c8;
  array<upb_Arena_*,_11UL> *local_b8;
  HiRep local_b0;
  Notification local_a8;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_upb_mem_arena_test_cc:512:40)>
  local_98;
  array<upb_Arena_*,_11UL> local_88;
  
  bVar17 = 0;
  upb_Arena_SetMaxBlockSize(0x80);
  local_98.storage_.callback_buffer_ = (char  [8])upb_alloc_global;
  upb_alloc_global.func = checking_global_allocfunc;
  local_98.storage_.is_callback_engaged_ = true;
  lVar8 = 0;
  local_a8.mutex_.mu_.super___atomic_base<long>._M_i = (atomic<long>)(__atomic_base<long>)0x0;
  local_a8.notified_yet_._M_base._M_i = (__atomic_base<bool>)false;
  local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = (array<upb_Arena_*,_11UL> *)0x0;
  local_c8.ptr_dont_copy_me__upb_internal_use_only = (char *)0x0;
  local_c8.end_dont_copy_me__upb_internal_use_only = (char *)0x0;
  do {
    local_88._M_elems[0] = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
    lVar14 = 1;
    do {
      puVar5 = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
      local_88._M_elems[lVar14] = puVar5;
      upb_Arena_Fuse(*(upb_Arena **)(local_98.storage_.callback_buffer_ + lVar14 * 8),puVar5);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0xb);
    if ((array<upb_Arena_*,_11UL> *)local_c8.end_dont_copy_me__upb_internal_use_only == local_b8) {
      std::vector<std::array<upb_Arena*,11ul>,std::allocator<std::array<upb_Arena*,11ul>>>::
      _M_realloc_insert<std::array<upb_Arena*,11ul>const&>
                ((vector<std::array<upb_Arena*,11ul>,std::allocator<std::array<upb_Arena*,11ul>>> *)
                 &local_c8,(iterator)local_c8.end_dont_copy_me__upb_internal_use_only,&local_88);
      __args = extraout_RDX_00;
    }
    else {
      paVar12 = &local_88;
      paVar13 = (array<upb_Arena_*,_11UL> *)local_c8.end_dont_copy_me__upb_internal_use_only;
      for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
        paVar13->_M_elems[0] = paVar12->_M_elems[0];
        paVar12 = (array<upb_Arena_*,_11UL> *)((long)paVar12 + ((ulong)bVar17 * -2 + 1) * 8);
        paVar13 = (array<upb_Arena_*,_11UL> *)((long)paVar13 + ((ulong)bVar17 * -2 + 1) * 8);
      }
      local_c8.end_dont_copy_me__upb_internal_use_only =
           (char *)((long)local_c8.end_dont_copy_me__upb_internal_use_only + 0x58);
      __args = extraout_RDX;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 10000);
  local_b0.lo_ = 0xfffffff8;
  local_b0.hi_ = 0x7fffffff;
  HVar15.lo_ = 0;
  HVar15.hi_ = 0;
  do {
    ptVar3 = local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ptVar2 = local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_88._M_elems[1] = (upb_Arena *)&local_a8;
    local_88._M_elems[2] = &local_c8;
    local_88._M_elems[0] = (upb_Arena *)HVar15;
    if (local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      if ((long)local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar9 = (long)local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      uVar11 = uVar9 + (uVar9 == 0);
      local_d0 = uVar11 + uVar9;
      if (0xffffffffffffffe < local_d0) {
        local_d0 = 0xfffffffffffffff;
      }
      if (CARRY8(uVar11,uVar9)) {
        local_d0 = 0xfffffffffffffff;
      }
      if (local_d0 == 0) {
        paVar6 = (allocator_type *)0x0;
      }
      else {
        paVar6 = (allocator_type *)
                 __gnu_cxx::new_allocator<std::thread>::allocate
                           ((new_allocator<std::thread> *)&local_e8,local_d0,(void *)0x0);
        __args = extraout_RDX_02;
      }
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,(anonymous_namespace)::ArenaTest_FuzzFuseFreeAllocatorRace_Test::TestBody()::__1>
                (paVar6 + uVar9 * 8,(thread *)&local_88,__args);
      paVar10 = paVar6;
      for (paVar7 = (allocator_type *)ptVar2; paVar7 != (allocator_type *)ptVar3;
          paVar7 = paVar7 + 8) {
        *(id *)paVar10 = (id)0x0;
        *(native_handle_type *)paVar10 = (native_handle_type)*(id *)paVar7;
        *(id *)paVar7 = (id)0x0;
        paVar10 = paVar10 + 8;
      }
      __args = extraout_RDX_03;
      if ((allocator_type *)ptVar2 != (allocator_type *)0x0) {
        operator_delete(ptVar2,(long)local_e8.
                                     super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ptVar2);
        __args = extraout_RDX_04;
      }
      local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(paVar6 + local_d0 * 8);
      local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)paVar6;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,(anonymous_namespace)::ArenaTest_FuzzFuseFreeAllocatorRace_Test::TestBody()::__1>
                ((allocator_type *)
                 local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,(thread *)&local_88,__args);
      __args = extraout_RDX_01;
      paVar10 = (allocator_type *)
                local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(paVar10 + 8);
    HVar15 = (HiRep)((long)HVar15 + 1);
  } while (HVar15 != (HiRep)0xa);
  TVar18 = absl::lts_20250127::Now();
  local_88._M_elems[0] = (upb_Arena *)TVar18.rep_.rep_hi_;
  local_88._M_elems[1]._0_4_ = TVar18.rep_.rep_lo_;
  absl::lts_20250127::Duration::operator+=((Duration *)&local_88,(Duration)ZEXT812(2));
  uVar4 = (uint32_t)local_88._M_elems[1];
  puVar5 = local_88._M_elems[0];
  local_d0 = CONCAT44(local_d0._4_4_,(uint32_t)local_88._M_elems[1] + 1);
  lVar8 = 0x50;
  local_b0 = (HiRep)((long)local_b0 + 8);
  uVar11 = 0xffffffffffffffff;
  do {
    TVar18 = absl::lts_20250127::Now();
    HVar15 = TVar18.rep_.rep_hi_;
    if (HVar15 == (HiRep)puVar5) {
      if (HVar15 == local_b0) {
        bVar16 = TVar18.rep_.rep_lo_ + 1 < (uint)local_d0;
      }
      else {
        bVar16 = TVar18.rep_.rep_lo_ < uVar4;
      }
    }
    else {
      bVar16 = (long)HVar15 < (long)puVar5;
    }
    if ((!bVar16) ||
       ((ulong)(((long)local_c8.end_dont_copy_me__upb_internal_use_only -
                 (long)local_c8.ptr_dont_copy_me__upb_internal_use_only >> 3) * 0x2e8ba2e8ba2e8ba3)
        <= uVar11 + 1)) {
      absl::lts_20250127::Notification::Notify(&local_a8);
      while (ptVar2 = local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                      .super__Vector_impl_data._M_finish, uVar11 = uVar11 + 1,
            paVar6 = (allocator_type *)
                     local_e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar11 < (ulong)(((long)local_c8.end_dont_copy_me__upb_internal_use_only -
                              (long)local_c8.ptr_dont_copy_me__upb_internal_use_only >> 3) *
                            0x2e8ba2e8ba2e8ba3)) {
        pcVar1 = local_c8.ptr_dont_copy_me__upb_internal_use_only + lVar8;
        lVar8 = lVar8 + 0x58;
        upb_Arena_Free(*(upb_Arena **)pcVar1);
      }
      for (; paVar6 != (allocator_type *)ptVar2; paVar6 = paVar6 + 8) {
        std::thread::join();
      }
      if (local_c8.ptr_dont_copy_me__upb_internal_use_only != (char *)0x0) {
        operator_delete(local_c8.ptr_dont_copy_me__upb_internal_use_only,
                        (long)local_b8 - (long)local_c8.ptr_dont_copy_me__upb_internal_use_only);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_e8);
      absl::lts_20250127::Notification::~Notification(&local_a8);
      absl::lts_20250127::
      Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc:512:40)>
      ::~Cleanup(&local_98);
      return;
    }
    a = *(upb_Arena **)(local_c8.ptr_dont_copy_me__upb_internal_use_only + lVar8);
    pcVar1 = a->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)pcVar1) < 0x80) {
      _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,0x80);
    }
    else {
      if ((char *)((ulong)(pcVar1 + 7) & 0xfffffffffffffff8) != pcVar1) {
LAB_0017152f:
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      a->ptr_dont_copy_me__upb_internal_use_only = pcVar1 + 0x80;
    }
    pcVar1 = a->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)pcVar1) < 0x80) {
      _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,0x80);
    }
    else {
      if ((char *)((ulong)(pcVar1 + 7) & 0xfffffffffffffff8) != pcVar1) goto LAB_0017152f;
      a->ptr_dont_copy_me__upb_internal_use_only = pcVar1 + 0x80;
    }
    lVar8 = lVar8 + 0x58;
    upb_Arena_Free(a);
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

TEST(ArenaTest, FuzzFuseFreeAllocatorRace) {
  upb_Arena_SetMaxBlockSize(128);
  upb_alloc_func* old = upb_alloc_global.func;
  upb_alloc_global.func = checking_global_allocfunc;
  absl::Cleanup reset_max_block_size = [old] {
    upb_Arena_SetMaxBlockSize(UPB_PRIVATE(kUpbDefaultMaxBlockSize));
    upb_alloc_global.func = old;
  };
  absl::Notification done;
  std::vector<std::thread> threads;
  size_t thread_count = 10;
  std::vector<std::array<upb_Arena*, 11>> arenas;
  for (size_t i = 0; i < 10000; ++i) {
    std::array<upb_Arena*, 11> arr;
    arr[0] = upb_Arena_New();
    for (size_t j = 1; j < thread_count + 1; ++j) {
      arr[j] = upb_Arena_New();
      upb_Arena_Fuse(arr[j - 1], arr[j]);
    }
    arenas.push_back(arr);
  }
  for (size_t i = 0; i < thread_count; ++i) {
    size_t tid = i;
    threads.emplace_back([&, tid]() {
      size_t arenaCtr = 0;
      while (!done.HasBeenNotified() && arenaCtr < arenas.size()) {
        upb_Arena* read = arenas[arenaCtr++][tid];
        (void)upb_Arena_Malloc(read, 128);
        (void)upb_Arena_Malloc(read, 128);
        upb_Arena_Free(read);
      }
      while (arenaCtr < arenas.size()) {
        upb_Arena_Free(arenas[arenaCtr++][tid]);
      }
    });
  }
  auto end = absl::Now() + absl::Seconds(2);
  size_t arenaCtr = 0;
  while (absl::Now() < end && arenaCtr < arenas.size()) {
    upb_Arena* read = arenas[arenaCtr++][thread_count];
    (void)upb_Arena_Malloc(read, 128);
    (void)upb_Arena_Malloc(read, 128);
    upb_Arena_Free(read);
  }
  done.Notify();
  while (arenaCtr < arenas.size()) {
    upb_Arena_Free(arenas[arenaCtr++][thread_count]);
  }
  for (auto& t : threads) t.join();
}